

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_712d::StatePointer_CopyAssignment_Test::TestBody
          (StatePointer_CopyAssignment_Test *this)

{
  bool bVar1;
  char *pcVar2;
  state_type state;
  type local_54;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> sStack_50;
  Foo foo;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p1;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p2;
  AssertionResult gtest_ar;
  AssertHelper local_28;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            (&stack0xffffffffffffffb0,&local_54,1);
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            (&p1,(nullptr_t)0x0,state);
  testing::internal::
  CmpHelperNE<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((internal *)&p2,"p1","p2",&stack0xffffffffffffffb0,&p1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p2);
  if (bVar1) {
    testing::AssertionResult::~AssertionResult((AssertionResult *)&p2);
    p1.m_ptr_and_state = sStack_50.m_ptr_and_state;
    testing::internal::EqHelper<false>::
    Compare<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
              ((EqHelper<false> *)&p2,"p1","p2",&stack0xffffffffffffffb0,&p1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p2);
    if (bVar1) goto LAB_00127e9f;
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p2);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p2);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_28);
  testing::Message::~Message((Message *)&gtest_ar.message_);
LAB_00127e9f:
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p2);
  return;
}

Assistant:

TEST(StatePointer, CopyAssignment) {
	Foo foo;
	state_ptr<Foo> p1{&foo, 1};
	state_ptr<Foo> p2{nullptr, 0};
	ASSERT_NE(p1, p2);
	p2 = p1;
	ASSERT_EQ(p1, p2);
}